

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O3

DecodeStatus DecodeFMOVLaneInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus extraout_EAX;
  uint *puVar1;
  uint *puVar2;
  
  puVar2 = GPR64DecoderTable;
  puVar1 = FPR128DecoderTable;
  if ((Insn >> 0x10 & 1) == 0) {
    puVar1 = GPR64DecoderTable;
    puVar2 = FPR128DecoderTable;
  }
  MCOperand_CreateReg0(Inst,puVar1[Insn & 0x1f]);
  MCOperand_CreateReg0(Inst,*(uint *)((long)puVar2 + (ulong)(Insn >> 3 & 0x7c)));
  MCOperand_CreateImm0(Inst,1);
  return extraout_EAX;
}

Assistant:

static DecodeStatus DecodeFMOVLaneInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address,
		void *Decoder)
{
	// This decoder exists to add the dummy Lane operand to the MCInst, which must
	// be 1 in assembly but has no other real manifestation.
	unsigned Rd = fieldFromInstruction(Insn, 0, 5);
	unsigned Rn = fieldFromInstruction(Insn, 5, 5);
	unsigned IsToVec = fieldFromInstruction(Insn, 16, 1);

	if (IsToVec) {
		DecodeFPR128RegisterClass(Inst, Rd, Address, Decoder);
		DecodeGPR64RegisterClass(Inst, Rn, Address, Decoder);
	} else {
		DecodeGPR64RegisterClass(Inst, Rd, Address, Decoder);
		DecodeFPR128RegisterClass(Inst, Rn, Address, Decoder);
	}

	// Add the lane
	MCOperand_CreateImm0(Inst, 1);

	return Success;
}